

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cpp
# Opt level: O1

void precalc(GameBoard *gameBoard,int *myele,int *enemyele,int *enemyht)

{
  int *piVar1;
  pointer pTVar2;
  int iVar3;
  Tetris *loc;
  pointer pTVar4;
  Tetris *loc_1;
  int ele;
  int ht;
  vector<Tetris,_std::allocator<Tetris>_> enemyloc;
  vector<Tetris,_std::allocator<Tetris>_> myloc;
  Board brd;
  int local_120;
  int local_11c;
  int *local_118;
  int *local_110;
  vector<Tetris,_std::allocator<Tetris>_> local_108;
  vector<Tetris,_std::allocator<Tetris>_> local_e8;
  Block local_c8;
  Board local_b8;
  
  local_e8.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_start = (Tetris *)0x0;
  local_e8.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Tetris *)0x0;
  local_e8.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_118 = enemyele;
  GameBoard::getPlaces(gameBoard,gameBoard->currBotColor,gameBoard->currBlockType,&local_e8,true);
  local_108.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_start = (Tetris *)0x0;
  local_108.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Tetris *)0x0;
  local_108.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  GameBoard::getPlaces(gameBoard,gameBoard->enemyColor,gameBoard->enemyType,&local_108,true);
  pTVar2 = local_e8.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *myele = 0;
  *local_118 = 0;
  *enemyht = 0x14;
  local_110 = enemyht;
  if (local_e8.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_e8.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pTVar4 = local_e8.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      Board::Board(&local_b8,gameBoard->currBotColor,gameBoard);
      Block::Block(&local_c8,*pTVar4);
      eval(&local_b8,&local_c8,&local_120,&local_11c);
      iVar3 = local_120;
      if (local_120 < *myele) {
        iVar3 = *myele;
      }
      *myele = iVar3;
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar2);
  }
  pTVar2 = local_108.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar1 = local_110;
  if (local_108.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_108.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pTVar4 = local_108.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      Board::Board(&local_b8,gameBoard->enemyColor,gameBoard);
      Block::Block(&local_c8,*pTVar4);
      eval(&local_b8,&local_c8,&local_120,&local_11c);
      iVar3 = local_120;
      if (local_120 < *local_118) {
        iVar3 = *local_118;
      }
      *local_118 = iVar3;
      iVar3 = *piVar1;
      if (local_11c < iVar3) {
        iVar3 = local_11c;
      }
      *piVar1 = iVar3;
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar2);
  }
  if (local_108.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
      _M_start != (Tetris *)0x0) {
    operator_delete(local_108.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
      _M_start != (Tetris *)0x0) {
    operator_delete(local_e8.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void precalc(GameBoard& gameBoard, int& myele, int& enemyele, int& enemyht) {
    std::vector<Tetris> myloc;
    gameBoard.getPlaces(gameBoard.currBotColor, gameBoard.currBlockType, myloc);
    std::vector<Tetris> enemyloc;
    gameBoard.getPlaces(gameBoard.enemyColor, gameBoard.enemyType, enemyloc);
    myele = 0;
    enemyele = 0;
    enemyht = 20;
    for (auto& loc : myloc) {
        int ht, ele;
        Board brd = Board(gameBoard.currBotColor, gameBoard);
        eval(brd, Block(loc), ele, ht);
        myele = std::max(myele, ele);
    }
    for (auto& loc : enemyloc) {
        int ht, ele;
        Board brd = Board(gameBoard.enemyColor, gameBoard);
        eval(brd, Block(loc), ele, ht);
        enemyele = std::max(enemyele, ele);
        enemyht = std::min(enemyht, ht);
    }
}